

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall
re2::Prog::EmitList(Prog *this,int root,SparseArray<int> *rootmap,
                   vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,SparseSet *q,
                   vector<int,_std::allocator<int>_> *stk)

{
  anon_union_4_5_a3ff96c3_for_Inst_2 aVar1;
  vector<int,_std::allocator<int>_> *this_00;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *this_01;
  bool bVar2;
  int iVar3;
  InstOp IVar4;
  reference pvVar5;
  reference pvVar6;
  ostream *poVar7;
  size_type sVar8;
  int local_1d8 [4];
  LogMessage local_1c8;
  Inst *local_48;
  Inst *ip;
  vector<int,_std::allocator<int>_> *pvStack_38;
  int id;
  vector<int,_std::allocator<int>_> *stk_local;
  SparseSet *q_local;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat_local;
  SparseArray<int> *rootmap_local;
  Prog *pPStack_10;
  int root_local;
  Prog *this_local;
  
  pvStack_38 = stk;
  stk_local = (vector<int,_std::allocator<int>_> *)q;
  q_local = (SparseSet *)flat;
  flat_local = (vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)rootmap;
  rootmap_local._4_4_ = root;
  pPStack_10 = this;
  SparseSet::clear(q);
  std::vector<int,_std::allocator<int>_>::clear(pvStack_38);
  std::vector<int,_std::allocator<int>_>::push_back
            (pvStack_38,(value_type_conflict *)((long)&rootmap_local + 4));
LAB_0017fc5c:
  do {
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(pvStack_38);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::back(pvStack_38);
    ip._4_4_ = *pvVar5;
    std::vector<int,_std::allocator<int>_>::pop_back(pvStack_38);
    while (bVar2 = SparseSet::contains((SparseSet *)stk_local,ip._4_4_), !bVar2) {
      SparseSet::insert_new((SparseSet *)stk_local,ip._4_4_);
      if ((ip._4_4_ != rootmap_local._4_4_) &&
         (bVar2 = SparseArray<int>::has_index((SparseArray<int> *)flat_local,ip._4_4_), bVar2)) {
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        Inst::set_opcode(pvVar6,kInstNop);
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        iVar3 = SparseArray<int>::get_existing((SparseArray<int> *)flat_local,ip._4_4_);
        Inst::set_out(pvVar6,iVar3);
        break;
      }
      local_48 = inst(this,ip._4_4_);
      IVar4 = Inst::opcode(local_48);
      switch(IVar4) {
      case kInstAltMatch:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        Inst::set_opcode(pvVar6,kInstAltMatch);
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        sVar8 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size
                          ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        Inst::set_out(pvVar6,(int)sVar8);
        sVar8 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::size
                          ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        (pvVar6->field_1).out1_ = (int)sVar8 + 1;
      case kInstAlt:
        this_00 = pvStack_38;
        local_1d8[0] = Inst::out1(local_48);
        std::vector<int,_std::allocator<int>_>::push_back(this_00,local_1d8);
        ip._4_4_ = Inst::out(local_48);
        break;
      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        aVar1 = local_48->field_1;
        pvVar6->out_opcode_ = local_48->out_opcode_;
        pvVar6->field_1 = aVar1;
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        this_01 = flat_local;
        iVar3 = Inst::out(local_48);
        iVar3 = SparseArray<int>::get_existing((SparseArray<int> *)this_01,iVar3);
        Inst::set_out(pvVar6,iVar3);
        goto LAB_0017fc5c;
      case kInstMatch:
      case kInstFail:
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::emplace_back<>
                  ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        pvVar6 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::back
                           ((vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *)q_local);
        aVar1 = local_48->field_1;
        pvVar6->out_opcode_ = local_48->out_opcode_;
        pvVar6->field_1 = aVar1;
        goto LAB_0017fc5c;
      case kInstNop:
        ip._4_4_ = Inst::out(local_48);
        break;
      default:
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.cc",
                   0x213);
        poVar7 = LogMessage::stream(&local_1c8);
        poVar7 = std::operator<<(poVar7,"unhandled opcode: ");
        IVar4 = Inst::opcode(local_48);
        std::ostream::operator<<(poVar7,IVar4);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c8);
        goto LAB_0017fc5c;
      }
    }
  } while( true );
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap, vector<Inst>* flat,
                    SparseSet* q, vector<int>* stk) {
  q->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (q->contains(id))
      continue;
    q->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32>(flat->size())+1;
        // Fall through.

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}